

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O3

Am_Object_Data * Am_Object_Data::Narrow(Am_Wrapper *value)

{
  int iVar1;
  
  if ((value != (Am_Wrapper *)0x0) &&
     (iVar1 = (**(value->super_Am_Registered_Type)._vptr_Am_Registered_Type)(),
     (Am_ID_Tag)iVar1 == id)) {
    return (Am_Object_Data *)value;
  }
  return (Am_Object_Data *)0x0;
}

Assistant:

Am_Object_Data::Am_Object_Data()
    : prototype(nullptr), first_instance(nullptr), next_instance(nullptr),
      first_part(nullptr), next_part(nullptr), default_bits(0x0001),
      bits_mask(0x0000), owner_slot(nullptr, Am_OWNER),
      part_slot(nullptr, Am_NO_SLOT), data(sizeof(Am_Slot_Data *))
{
#ifdef LEAK_TRACE
  std::cout << "ROOT\t\tcreated: " << this << "\tReferences: " << Ref_Count()
            << std::endl;
#endif
#ifdef DEBUG
  Am_Register_Name(this, append_number_to_name("ROOT"));
#endif
  owner_slot.context = this;
  owner_slot.value.wrapper_value = nullptr;
  owner_slot.type = Am_OBJECT;
  default_rule = Am_INHERIT;
  part_slot.value.wrapper_value = this;
  part_slot.type = Am_OBJECT;
  demon_set = new Am_Demon_Set_Data();
  demons_active = DEMONS_ACTIVE;

  // Prevents deallocation due to ref count.
  Note_Reference();
}